

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

bool_t prf_matrix_save_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  float32_t *pfVar1;
  bool_t bVar2;
  
  if (node->opcode == prf_matrix_info.opcode) {
    bf_put_uint16_be(bfile,node->opcode);
    bf_put_uint16_be(bfile,node->length);
    pfVar1 = (float32_t *)node->data;
    bf_put_float32_be(bfile,*pfVar1);
    bf_put_float32_be(bfile,pfVar1[4]);
    bf_put_float32_be(bfile,pfVar1[8]);
    bf_put_float32_be(bfile,pfVar1[0xc]);
    bf_put_float32_be(bfile,pfVar1[1]);
    bf_put_float32_be(bfile,pfVar1[5]);
    bf_put_float32_be(bfile,pfVar1[9]);
    bf_put_float32_be(bfile,pfVar1[0xd]);
    bf_put_float32_be(bfile,pfVar1[2]);
    bf_put_float32_be(bfile,pfVar1[6]);
    bf_put_float32_be(bfile,pfVar1[10]);
    bf_put_float32_be(bfile,pfVar1[0xe]);
    bf_put_float32_be(bfile,pfVar1[3]);
    bf_put_float32_be(bfile,pfVar1[7]);
    bf_put_float32_be(bfile,pfVar1[0xb]);
    bf_put_float32_be(bfile,pfVar1[0xf]);
    bVar2 = 1;
    if (0x44 < node->length) {
      bf_write(bfile,node->data + 0x40,node->length - 0x44);
    }
  }
  else {
    bVar2 = 0;
    prf_error(9,"tried matrix save method on node of type %d.");
  }
  return bVar2;
}

Assistant:

static
bool_t
prf_matrix_save_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    int pos;

    assert( node != NULL && bfile != NULL );

    if ( node->opcode != prf_matrix_info.opcode ) {
        prf_error( 9, "tried matrix save method on node of type %d.",
            node->opcode );
        return FALSE;
    }

    bf_put_uint16_be( bfile, node->opcode );
    bf_put_uint16_be( bfile, node->length );

    pos = 4;
    do {
        node_data * data;
        data = (node_data *) node->data;
        bf_put_float32_be( bfile, data->matrix[0][0] ); pos += 4;
        bf_put_float32_be( bfile, data->matrix[1][0] ); pos += 4;
        bf_put_float32_be( bfile, data->matrix[2][0] ); pos += 4;
        bf_put_float32_be( bfile, data->matrix[3][0] ); pos += 4;
        bf_put_float32_be( bfile, data->matrix[0][1] ); pos += 4;
        bf_put_float32_be( bfile, data->matrix[1][1] ); pos += 4;
        bf_put_float32_be( bfile, data->matrix[2][1] ); pos += 4;
        bf_put_float32_be( bfile, data->matrix[3][1] ); pos += 4;
        bf_put_float32_be( bfile, data->matrix[0][2] ); pos += 4;
        bf_put_float32_be( bfile, data->matrix[1][2] ); pos += 4;
        bf_put_float32_be( bfile, data->matrix[2][2] ); pos += 4;
        bf_put_float32_be( bfile, data->matrix[3][2] ); pos += 4;
        bf_put_float32_be( bfile, data->matrix[0][3] ); pos += 4;
        bf_put_float32_be( bfile, data->matrix[1][3] ); pos += 4;
        bf_put_float32_be( bfile, data->matrix[2][3] ); pos += 4;
        bf_put_float32_be( bfile, data->matrix[3][3] ); pos += 4;
    } while ( FALSE );

    if ( node->length > pos )
        pos += bf_write( bfile, node->data + pos - 4 + NODE_DATA_PAD,
            node->length - pos );

    return TRUE;
}